

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O3

void __thiscall httplib::Response::~Response(Response *this)

{
  ContentProviderResourceReleaser *pCVar1;
  _Manager_type p_Var2;
  pointer pcVar3;
  undefined8 in_RAX;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  undefined8 uStack_18;
  
  uStack_18 = in_RAX;
  if ((this->content_provider_resource_releaser_).super__Function_base._M_manager !=
      (_Manager_type)0x0) {
    pCVar1 = &this->content_provider_resource_releaser_;
    uStack_18 = CONCAT17(this->content_provider_success_,(int7)in_RAX);
    (*(this->content_provider_resource_releaser_)._M_invoker)
              ((_Any_data *)pCVar1,(bool *)((long)&uStack_18 + 7));
    p_Var2 = (this->content_provider_resource_releaser_).super__Function_base._M_manager;
    if (p_Var2 != (_Manager_type)0x0) {
      (*p_Var2)((_Any_data *)pCVar1,(_Any_data *)pCVar1,__destroy_functor);
    }
  }
  p_Var2 = (this->content_provider_).super__Function_base._M_manager;
  if (p_Var2 != (_Manager_type)0x0) {
    (*p_Var2)((_Any_data *)&this->content_provider_,(_Any_data *)&this->content_provider_,
              __destroy_functor);
  }
  pcVar3 = (this->location)._M_dataplus._M_p;
  paVar4 = &(this->location).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 != paVar4) {
    operator_delete(pcVar3,paVar4->_M_allocated_capacity + 1);
  }
  pcVar3 = (this->body)._M_dataplus._M_p;
  paVar4 = &(this->body).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 != paVar4) {
    operator_delete(pcVar3,paVar4->_M_allocated_capacity + 1);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&(this->headers)._M_t);
  pcVar3 = (this->reason)._M_dataplus._M_p;
  paVar4 = &(this->reason).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 != paVar4) {
    operator_delete(pcVar3,paVar4->_M_allocated_capacity + 1);
  }
  pcVar3 = (this->version)._M_dataplus._M_p;
  paVar4 = &(this->version).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 != paVar4) {
    operator_delete(pcVar3,paVar4->_M_allocated_capacity + 1);
  }
  return;
}

Assistant:

~Response() {
    if (content_provider_resource_releaser_) {
      content_provider_resource_releaser_(content_provider_success_);
    }
  }